

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O3

void slang::ast::ContinuousAssignSymbol::fromSyntax
               (Compilation *compilation,ContinuousAssignSyntax *syntax,ASTContext *parentContext,
               SmallVectorBase<const_slang::ast::Symbol_*> *results,
               SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets)

{
  long lVar1;
  group_type_pointer pgVar2;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> args;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  byte bVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  byte bVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  byte bVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  byte bVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  byte bVar19;
  size_t __n;
  char *__s1;
  value_type_pointer pbVar20;
  undefined8 uVar21;
  uchar uVar22;
  uchar uVar23;
  uchar uVar24;
  byte bVar25;
  uchar uVar26;
  uchar uVar27;
  uchar uVar28;
  byte bVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  byte bVar33;
  uchar uVar34;
  uchar uVar35;
  uchar uVar36;
  byte bVar37;
  int iVar38;
  uint uVar39;
  NetType *netType;
  ulong uVar40;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar41;
  ContinuousAssignSymbol *pCVar42;
  ulong uVar43;
  ulong uVar44;
  size_type __rlen;
  undefined1 auVar45 [16];
  uchar uVar46;
  uchar uVar47;
  uchar uVar48;
  byte bVar49;
  uchar uVar50;
  uchar uVar51;
  uchar uVar52;
  byte bVar53;
  uchar uVar54;
  uchar uVar55;
  uchar uVar56;
  byte bVar57;
  uchar uVar58;
  uchar uVar59;
  uchar uVar60;
  byte bVar61;
  size_t pos;
  value_type *elements;
  SmallVector<const_slang::syntax::IdentifierNameSyntax_*,_5UL> implicitNetNames;
  locator res;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  seenNames;
  ASTContext context;
  string_view local_220;
  NetType *local_210;
  Compilation *local_208;
  size_t local_200;
  ContinuousAssignSymbol *local_1f8;
  ulong local_1f0;
  SmallVectorBase<const_slang::ast::Symbol_*> *local_1e8;
  SmallVectorBase<const_slang::ast::Symbol_*> *local_1e0;
  ulong local_1d8;
  SymbolKind *local_1d0;
  size_t local_1c8;
  IdentifierNameSyntax *local_1c0;
  ulong local_1b8;
  value_type_pointer local_1b0;
  ulong local_1a8;
  undefined1 local_1a0 [64];
  locator local_160;
  uchar local_148;
  uchar uStack_147;
  uchar uStack_146;
  byte bStack_145;
  uchar uStack_144;
  uchar uStack_143;
  uchar uStack_142;
  byte bStack_141;
  uchar uStack_140;
  uchar uStack_13f;
  uchar uStack_13e;
  byte bStack_13d;
  uchar uStack_13c;
  uchar uStack_13b;
  uchar uStack_13a;
  byte bStack_139;
  uchar local_138;
  uchar uStack_137;
  uchar uStack_136;
  byte bStack_135;
  uchar uStack_134;
  uchar uStack_133;
  uchar uStack_132;
  byte bStack_131;
  uchar uStack_130;
  uchar uStack_12f;
  uchar uStack_12e;
  byte bStack_12d;
  uchar uStack_12c;
  uchar uStack_12b;
  uchar uStack_12a;
  byte bStack_129;
  undefined1 local_128 [136];
  allocator_type local_a0;
  undefined1 local_98 [24];
  value_type_pointer pbStack_80;
  undefined1 local_78 [16];
  ASTContext local_68;
  
  local_1e0 = implicitNets;
  ASTContext::resetFlags(&local_68,parentContext,(bitmask<slang::ast::ASTFlags>)0x20);
  netType = Scope::getDefaultNetType(local_68.scope.ptr);
  local_128._128_8_ = local_128;
  local_98._0_8_ = 0x3f;
  local_98._8_8_ = 1;
  stack0xffffffffffffff78 = ZEXT816(0x92b3d0);
  local_78 = (undefined1  [16])0x0;
  uVar40 = (syntax->assignments).elements._M_extent._M_extent_value + 1;
  local_a0.storage = (Storage *)local_128._128_8_;
  if (1 < uVar40) {
    local_1a8 = uVar40 >> 1;
    uVar40 = 0;
    local_210 = netType;
    local_208 = compilation;
    local_1e8 = results;
    do {
      ppSVar41 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                           ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                            ((syntax->assignments).elements._M_ptr + uVar40 * 2));
      args = *ppSVar41;
      if ((netType->netKind != Unknown) &&
         (((SyntaxNode *)&args->kind)->kind == AssignmentExpression)) {
        local_1a0._0_8_ = local_1a0 + 0x18;
        local_1a0._8_8_ = 0;
        local_1a0._16_8_ = 5;
        Expression::findPotentiallyImplicitNets
                  (*(SyntaxNode **)(args + 1),&local_68,
                   (SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*> *)local_1a0);
        if (local_1a0._8_8_ != 0) {
          local_1d0 = &((Symbol *)local_1a0._0_8_)->kind + local_1a0._8_8_ * 2;
          pCVar42 = (ContinuousAssignSymbol *)local_1a0._0_8_;
          do {
            local_1c0 = *(IdentifierNameSyntax **)&pCVar42->super_Symbol;
            local_220 = parsing::Token::valueText(&local_1c0->identifier);
            local_200 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                        operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                    *)&local_a0,&local_220);
            uVar44 = local_200 >> (local_98[0] & 0x3f);
            uVar21 = local_98._16_8_;
            lVar1 = (local_200 & 0xff) * 4;
            uVar46 = (&UNK_0092f4ac)[lVar1];
            uVar47 = (&UNK_0092f4ad)[lVar1];
            uVar48 = (&UNK_0092f4ae)[lVar1];
            bVar49 = (&UNK_0092f4af)[lVar1];
            local_1b0 = pbStack_80;
            __n = local_220._M_len;
            __s1 = local_220._M_str;
            local_1b8 = (ulong)((uint)local_200 & 7);
            local_1d8 = local_98._8_8_;
            uVar43 = 0;
            uVar50 = uVar46;
            uVar51 = uVar47;
            uVar52 = uVar48;
            bVar53 = bVar49;
            uVar54 = uVar46;
            uVar55 = uVar47;
            uVar56 = uVar48;
            bVar57 = bVar49;
            uVar58 = uVar46;
            uVar59 = uVar47;
            uVar60 = uVar48;
            bVar61 = bVar49;
            local_1f8 = pCVar42;
            local_1c8 = uVar44;
            do {
              pbVar20 = local_1b0;
              pgVar2 = (group_type_pointer)(uVar21 + uVar44 * 0x10);
              local_138 = pgVar2->m[0].n;
              uStack_137 = pgVar2->m[1].n;
              uStack_136 = pgVar2->m[2].n;
              bStack_135 = pgVar2->m[3].n;
              uStack_134 = pgVar2->m[4].n;
              uStack_133 = pgVar2->m[5].n;
              uStack_132 = pgVar2->m[6].n;
              bStack_131 = pgVar2->m[7].n;
              uStack_130 = pgVar2->m[8].n;
              uStack_12f = pgVar2->m[9].n;
              uStack_12e = pgVar2->m[10].n;
              bStack_12d = pgVar2->m[0xb].n;
              uStack_12c = pgVar2->m[0xc].n;
              uStack_12b = pgVar2->m[0xd].n;
              uStack_12a = pgVar2->m[0xe].n;
              bVar3 = pgVar2->m[0xf].n;
              auVar45[0] = -(local_138 == uVar46);
              auVar45[1] = -(uStack_137 == uVar47);
              auVar45[2] = -(uStack_136 == uVar48);
              auVar45[3] = -(bStack_135 == bVar49);
              auVar45[4] = -(uStack_134 == uVar50);
              auVar45[5] = -(uStack_133 == uVar51);
              auVar45[6] = -(uStack_132 == uVar52);
              auVar45[7] = -(bStack_131 == bVar53);
              auVar45[8] = -(uStack_130 == uVar54);
              auVar45[9] = -(uStack_12f == uVar55);
              auVar45[10] = -(uStack_12e == uVar56);
              auVar45[0xb] = -(bStack_12d == bVar57);
              auVar45[0xc] = -(uStack_12c == uVar58);
              auVar45[0xd] = -(uStack_12b == uVar59);
              auVar45[0xe] = -(uStack_12a == uVar60);
              auVar45[0xf] = -(bVar3 == bVar61);
              local_1f0 = uVar44;
              bStack_129 = bVar3;
              uVar22 = uVar46;
              uVar23 = uVar47;
              uVar24 = uVar48;
              bVar25 = bVar49;
              uVar26 = uVar50;
              uVar27 = uVar51;
              uVar28 = uVar52;
              bVar29 = bVar53;
              uVar30 = uVar54;
              uVar31 = uVar55;
              uVar32 = uVar56;
              bVar33 = bVar57;
              uVar34 = uVar58;
              uVar35 = uVar59;
              uVar36 = uVar60;
              bVar37 = bVar61;
              netType = local_210;
              compilation = local_208;
              pCVar42 = local_1f8;
              uVar4 = local_148;
              uVar5 = uStack_147;
              uVar6 = uStack_146;
              bVar7 = bStack_145;
              uVar8 = uStack_144;
              uVar9 = uStack_143;
              uVar10 = uStack_142;
              bVar11 = bStack_141;
              uVar12 = uStack_140;
              uVar13 = uStack_13f;
              uVar14 = uStack_13e;
              bVar15 = bStack_13d;
              uVar16 = uStack_13c;
              uVar17 = uStack_13b;
              uVar18 = uStack_13a;
              bVar19 = bStack_139;
              for (uVar39 = (uint)(ushort)((ushort)(SUB161(auVar45 >> 7,0) & 1) |
                                           (ushort)(SUB161(auVar45 >> 0xf,0) & 1) << 1 |
                                           (ushort)(SUB161(auVar45 >> 0x17,0) & 1) << 2 |
                                           (ushort)(SUB161(auVar45 >> 0x1f,0) & 1) << 3 |
                                           (ushort)(SUB161(auVar45 >> 0x27,0) & 1) << 4 |
                                           (ushort)(SUB161(auVar45 >> 0x2f,0) & 1) << 5 |
                                           (ushort)(SUB161(auVar45 >> 0x37,0) & 1) << 6 |
                                           (ushort)(SUB161(auVar45 >> 0x3f,0) & 1) << 7 |
                                           (ushort)(SUB161(auVar45 >> 0x47,0) & 1) << 8 |
                                           (ushort)(SUB161(auVar45 >> 0x4f,0) & 1) << 9 |
                                           (ushort)(SUB161(auVar45 >> 0x57,0) & 1) << 10 |
                                           (ushort)(SUB161(auVar45 >> 0x5f,0) & 1) << 0xb |
                                           (ushort)(SUB161(auVar45 >> 0x67,0) & 1) << 0xc |
                                           (ushort)(SUB161(auVar45 >> 0x6f,0) & 1) << 0xd |
                                          (ushort)(SUB161(auVar45 >> 0x77,0) & 1) << 0xe);
                  bStack_139 = bVar37, uStack_13a = uVar36, uStack_13b = uVar35, uStack_13c = uVar34
                  , bStack_13d = bVar33, uStack_13e = uVar32, uStack_13f = uVar31,
                  uStack_140 = uVar30, bStack_141 = bVar29, uStack_142 = uVar28, uStack_143 = uVar27
                  , uStack_144 = uVar26, bStack_145 = bVar25, uStack_146 = uVar24,
                  uStack_147 = uVar23, local_148 = uVar22, local_210 = netType,
                  local_208 = compilation, local_1f8 = pCVar42, uVar39 != 0;
                  uVar39 = uVar39 - 1 & uVar39) {
                iVar38 = 0;
                if (uVar39 != 0) {
                  for (; (uVar39 >> iVar38 & 1) == 0; iVar38 = iVar38 + 1) {
                  }
                }
                if ((__n == *(size_t *)
                             ((long)&pbVar20[uVar44 * 0xf]._M_len + (ulong)(uint)(iVar38 << 4))) &&
                   ((__n == 0 ||
                    (iVar38 = bcmp(__s1,*(void **)((long)&pbVar20[uVar44 * 0xf]._M_str +
                                                  (ulong)(uint)(iVar38 << 4)),__n),
                    netType = local_210, compilation = local_208, pCVar42 = local_1f8,
                    uVar46 = local_148, uVar47 = uStack_147, uVar48 = uStack_146,
                    bVar49 = bStack_145, uVar50 = uStack_144, uVar51 = uStack_143,
                    uVar52 = uStack_142, bVar53 = bStack_141, uVar54 = uStack_140,
                    uVar55 = uStack_13f, uVar56 = uStack_13e, bVar57 = bStack_13d,
                    uVar58 = uStack_13c, uVar59 = uStack_13b, uVar60 = uStack_13a,
                    bVar61 = bStack_139, iVar38 == 0)))) goto LAB_0077dcfb;
                uVar22 = local_148;
                uVar23 = uStack_147;
                uVar24 = uStack_146;
                bVar25 = bStack_145;
                uVar26 = uStack_144;
                uVar27 = uStack_143;
                uVar28 = uStack_142;
                bVar29 = bStack_141;
                uVar30 = uStack_140;
                uVar31 = uStack_13f;
                uVar32 = uStack_13e;
                bVar33 = bStack_13d;
                uVar34 = uStack_13c;
                uVar35 = uStack_13b;
                uVar36 = uStack_13a;
                bVar37 = bStack_139;
                netType = local_210;
                compilation = local_208;
                pCVar42 = local_1f8;
                uVar4 = local_148;
                uVar5 = uStack_147;
                uVar6 = uStack_146;
                bVar7 = bStack_145;
                uVar8 = uStack_144;
                uVar9 = uStack_143;
                uVar10 = uStack_142;
                bVar11 = bStack_141;
                uVar12 = uStack_140;
                uVar13 = uStack_13f;
                uVar14 = uStack_13e;
                bVar15 = bStack_13d;
                uVar16 = uStack_13c;
                uVar17 = uStack_13b;
                uVar18 = uStack_13a;
                bVar19 = bStack_139;
              }
              local_148 = uVar4;
              uStack_147 = uVar5;
              uStack_146 = uVar6;
              bStack_145 = bVar7;
              uStack_144 = uVar8;
              uStack_143 = uVar9;
              uStack_142 = uVar10;
              bStack_141 = bVar11;
              uStack_140 = uVar12;
              uStack_13f = uVar13;
              uStack_13e = uVar14;
              bStack_13d = bVar15;
              uStack_13c = uVar16;
              uStack_13b = uVar17;
              uStack_13a = uVar18;
              bStack_139 = bVar19;
              if (((&boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     is_not_overflowed(unsigned_long)::shift)[local_1b8] & bVar3) == 0) break;
              lVar1 = uVar43 + local_1f0;
              uVar43 = uVar43 + 1;
              uVar44 = lVar1 + 1U & local_1d8;
            } while (uVar43 <= local_1d8);
            if ((ulong)local_78._8_8_ < (ulong)local_78._0_8_) {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
              ::nosize_unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>>
                        (&local_160,
                         (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                          *)&local_a0,(arrays_type *)local_98,local_1c8,local_200,&local_220);
              local_78._8_8_ = local_78._8_8_ + 1;
            }
            else {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
              ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>>
                        (&local_160,
                         (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,128ul,16ul>>
                          *)&local_a0,local_200,&local_220);
            }
            local_160.pg = (group15<boost::unordered::detail::foa::plain_integral> *)
                           NetSymbol::createImplicit(compilation,local_1c0,netType);
            SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                      ((SmallVectorBase<slang::ast::Symbol_const*> *)local_1e0,(Symbol **)&local_160
                      );
LAB_0077dcfb:
            pCVar42 = (ContinuousAssignSymbol *)&(pCVar42->super_Symbol).name;
          } while (pCVar42 != (ContinuousAssignSymbol *)local_1d0);
        }
        results = local_1e8;
        if ((ContinuousAssignSymbol *)local_1a0._0_8_ !=
            (ContinuousAssignSymbol *)(local_1a0 + 0x18)) {
          operator_delete((void *)local_1a0._0_8_);
          results = local_1e8;
        }
      }
      pCVar42 = BumpAllocator::
                emplace<slang::ast::ContinuousAssignSymbol,slang::syntax::ExpressionSyntax_const&>
                          (&compilation->super_BumpAllocator,(ExpressionSyntax *)args);
      syntax_00._M_ptr =
           (syntax->super_MemberSyntax).attributes.
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
      syntax_00._M_extent._M_extent_value =
           (syntax->super_MemberSyntax).attributes.
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
           _M_extent_value;
      Symbol::setAttributes(&pCVar42->super_Symbol,local_68.scope.ptr,syntax_00);
      local_1a0._0_8_ = pCVar42;
      SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                ((SmallVectorBase<slang::ast::Symbol_const*> *)results,(Symbol **)local_1a0);
      uVar40 = uVar40 + 1;
    } while (uVar40 != local_1a8);
  }
  boost::unordered::detail::foa::
  table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  ::delete_(local_a0,(table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                      *)local_98);
  return;
}

Assistant:

void ContinuousAssignSymbol::fromSyntax(Compilation& compilation,
                                        const ContinuousAssignSyntax& syntax,
                                        const ASTContext& parentContext,
                                        SmallVectorBase<const Symbol*>& results,
                                        SmallVectorBase<const Symbol*>& implicitNets) {
    ASTContext context = parentContext.resetFlags(ASTFlags::NonProcedural);
    auto& netType = context.scope->getDefaultNetType();
    SmallSet<std::string_view, 8> seenNames;

    for (auto expr : syntax.assignments) {
        // If not explicitly disabled, check for net references on the lhs of each
        // assignment that should create implicit nets.
        if (!netType.isError()) {
            // The expression here should always be an assignment expression unless
            // the program is already ill-formed (diagnosed by the parser).
            if (expr->kind == SyntaxKind::AssignmentExpression) {
                SmallVector<const IdentifierNameSyntax*> implicitNetNames;
                Expression::findPotentiallyImplicitNets(*expr->as<BinaryExpressionSyntax>().left,
                                                        context, implicitNetNames);

                for (auto ins : implicitNetNames) {
                    if (seenNames.emplace(ins->identifier.valueText()).second) {
                        implicitNets.push_back(
                            &NetSymbol::createImplicit(compilation, *ins, netType));
                    }
                }
            }
        }

        auto symbol = compilation.emplace<ContinuousAssignSymbol>(*expr);
        symbol->setAttributes(*context.scope, syntax.attributes);
        results.push_back(symbol);
    }
}